

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_reduceTable(U32 *table,U32 size,U32 reducerValue)

{
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  U32 newVal;
  int column;
  U32 reducerThreshold;
  int rowNb;
  int cellNb;
  int nbRows;
  int local_2c;
  int local_28;
  int local_20;
  int local_1c;
  
  local_1c = 0;
  if ((in_ESI & 0xf) != 0) {
    __assert_fail("(size & (ZSTD_ROWSIZE-1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5abc,
                  "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)");
  }
  if (in_ESI < 0x80000000) {
    for (local_20 = 0; local_20 < (int)in_ESI / 0x10; local_20 = local_20 + 1) {
      for (local_28 = 0; local_28 < 0x10; local_28 = local_28 + 1) {
        if (*(uint *)(in_RDI + (long)local_1c * 4) < in_EDX + 2U) {
          local_2c = 0;
        }
        else {
          local_2c = *(int *)(in_RDI + (long)local_1c * 4) - in_EDX;
        }
        *(int *)(in_RDI + (long)local_1c * 4) = local_2c;
        local_1c = local_1c + 1;
      }
    }
    return;
  }
  __assert_fail("size < (1U<<31)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x5abd,
                "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)");
}

Assistant:

static void ZSTD_reduceTable(U32* const table, U32 const size, U32 const reducerValue)
{
    ZSTD_reduceTable_internal(table, size, reducerValue, 0);
}